

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void test_then_block(LexState *ls,int *escapelist)

{
  FuncState *fs;
  Dyndata *pDVar1;
  uint uVar2;
  int list;
  int l2;
  expdesc v;
  BlockCnt bl;
  expdesc eStack_58;
  BlockCnt local_40;
  
  fs = ls->fs;
  luaX_next(ls);
  subexpr(ls,&eStack_58,0);
  checknext(ls,0x113);
  if (((ls->t).token | 8U) == 0x10a) {
    luaK_goiffalse(ls->fs,&eStack_58);
    local_40.isloop = '\0';
    local_40.nactvar = fs->nactvar;
    pDVar1 = fs->ls->dyd;
    local_40.firstlabel = (pDVar1->label).n;
    local_40.firstgoto = (pDVar1->gt).n;
    local_40.upval = '\0';
    local_40.previous = fs->bl;
    fs->bl = &local_40;
    gotostat(ls,eStack_58.t);
    while ((ls->t).token == 0x3b) {
      luaX_next(ls);
    }
    uVar2 = (ls->t).token - 0x104;
    if ((uVar2 < 0x1e) && ((0x20000007U >> (uVar2 & 0x1f) & 1) != 0)) {
      leaveblock(fs);
      return;
    }
    list = luaK_jump(fs);
  }
  else {
    luaK_goiftrue(ls->fs,&eStack_58);
    local_40.isloop = '\0';
    local_40.nactvar = fs->nactvar;
    pDVar1 = fs->ls->dyd;
    local_40.firstlabel = (pDVar1->label).n;
    local_40.firstgoto = (pDVar1->gt).n;
    local_40.upval = '\0';
    local_40.previous = fs->bl;
    fs->bl = &local_40;
    list = eStack_58.f;
  }
  statlist(ls);
  leaveblock(fs);
  if (((ls->t).token & 0xfffffffeU) == 0x104) {
    l2 = luaK_jump(fs);
    luaK_concat(fs,escapelist,l2);
  }
  luaK_patchtohere(fs,list);
  return;
}

Assistant:

static void test_then_block (LexState *ls, int *escapelist) {
  /* test_then_block -> [IF | ELSEIF] cond THEN block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  expdesc v;
  int jf;  /* instruction to skip 'then' code (if condition is false) */
  luaX_next(ls);  /* skip IF or ELSEIF */
  expr(ls, &v);  /* read condition */
  checknext(ls, TK_THEN);
  if (ls->t.token == TK_GOTO || ls->t.token == TK_BREAK) {
    luaK_goiffalse(ls->fs, &v);  /* will jump to label if condition is true */
    enterblock(fs, &bl, 0);  /* must enter block before 'goto' */
    gotostat(ls, v.t);  /* handle goto/break */
    while (testnext(ls, ';')) {}  /* skip colons */
    if (block_follow(ls, 0)) {  /* 'goto' is the entire block? */
      leaveblock(fs);
      return;  /* and that is it */
    }
    else  /* must skip over 'then' part if condition is false */
      jf = luaK_jump(fs);
  }
  else {  /* regular case (not goto/break) */
    luaK_goiftrue(ls->fs, &v);  /* skip over block if condition is false */
    enterblock(fs, &bl, 0);
    jf = v.f;
  }
  statlist(ls);  /* 'then' part */
  leaveblock(fs);
  if (ls->t.token == TK_ELSE ||
      ls->t.token == TK_ELSEIF)  /* followed by 'else'/'elseif'? */
    luaK_concat(fs, escapelist, luaK_jump(fs));  /* must jump over it */
  luaK_patchtohere(fs, jf);
}